

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O0

void btreeblk_free(btreeblk_handle *handle)

{
  long in_RDI;
  uint32_t i;
  btreeblk_addr *item;
  btreeblk_block *block;
  list_elem *e;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  uint uVar1;
  btreeblk_handle *in_stack_ffffffffffffffe0;
  list_elem **__ptr;
  list_elem *local_10;
  
  local_10 = list_begin((list *)(in_RDI + 0x18));
  while (local_10 != (list_elem *)0x0) {
    local_10 = list_remove((list *)(in_RDI + 0x18),local_10);
    _btreeblk_free_dirty_block
              (in_stack_ffffffffffffffe0,
               (btreeblk_block *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  local_10 = list_begin((list *)(in_RDI + 0x28));
  while (local_10 != (list_elem *)0x0) {
    local_10 = list_remove((list *)(in_RDI + 0x28),local_10);
    _btreeblk_free_dirty_block
              (in_stack_ffffffffffffffe0,
               (btreeblk_block *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  local_10 = list_begin((list *)(in_RDI + 0x48));
  while (local_10 != (list_elem *)0x0) {
    __ptr = &local_10[-1].next;
    local_10 = list_next(local_10);
    free(*__ptr);
    free(__ptr);
  }
  for (uVar1 = 0; uVar1 < *(uint *)(in_RDI + 0x58); uVar1 = uVar1 + 1) {
    free(*(void **)(*(long *)(in_RDI + 0x60) + (ulong)uVar1 * 0x18 + 0x10));
  }
  free(*(void **)(in_RDI + 0x60));
  return;
}

Assistant:

void btreeblk_free(struct btreeblk_handle *handle)
{
    struct list_elem *e;
    struct btreeblk_block *block;

    // free all blocks in alc list
    e = list_begin(&handle->alc_list);
    while(e) {
        block = _get_entry(e, struct btreeblk_block, le);
        e = list_remove(&handle->alc_list, &block->le);
        _btreeblk_free_dirty_block(handle, block);
    }

    // free all blocks in read list
    // linked list
    e = list_begin(&handle->read_list);
    while(e) {
        block = _get_entry(e, struct btreeblk_block, le);
        e = list_remove(&handle->read_list, &block->le);
        _btreeblk_free_dirty_block(handle, block);
    }

#ifdef __BTREEBLK_BLOCKPOOL
    // free all blocks in the block pool
    struct btreeblk_addr *item;

    e = list_begin(&handle->blockpool);
    while(e){
        item = _get_entry(e, struct btreeblk_addr, le);
        e = list_next(e);

        free_align(item->addr);
        mempool_free(item);
    }
#endif

    uint32_t i;
    for (i=0;i<handle->nsb;++i){
        free(handle->sb[i].bitmap);
    }
    free(handle->sb);
}